

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O3

MPP_RET hal_h264e_vepu580_wait(void *hal,HalEncTask *task)

{
  HalH264eVepuStreamAmend *ctx;
  int type;
  uint uVar1;
  MppPacket s;
  MppCbCtx *ctx_00;
  undefined4 uVar2;
  MPP_RET MVar3;
  MPP_RET MVar4;
  HalVepu580RegSet *regs;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint len;
  undefined8 *param_00;
  EncOutParam param;
  HalEncTask *local_48;
  void *local_40;
  uint local_34;
  
  regs = (HalVepu580RegSet *)((long)(task->flags).reg_idx * 0x1cb8 + *(long *)((long)hal + 0x1a0));
  uVar1 = *(uint *)(*hal + 0xe9c);
  s = task->packet;
  sVar5 = mpp_packet_get_length(s);
  uVar6 = (task->rc_task->frm).val;
  uVar8 = (uint)uVar6;
  lVar7 = *hal;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_wait",hal);
    uVar6 = (task->rc_task->frm).val;
  }
  type = ((uVar8 & 0x20) >> 3) + 1;
  uVar8 = 0;
  if ((uVar6 & 4) == 0) {
    uVar8 = uVar1;
  }
  *(uint *)(lVar7 + 0x368) = uVar8;
  if (uVar8 == 0) {
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
    if (MVar3 == MPP_OK) {
      MVar4 = hal_h264e_vepu580_status_check(regs);
      MVar3 = MPP_NOK;
      if (MVar4 == MPP_OK) {
        task->hw_length = task->hw_length + (regs->reg_st).bs_lgth_l32;
        MVar3 = MPP_OK;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","poll cmd failed %d\n","hal_h264e_vepu580_wait",
                 (ulong)(uint)MVar3);
      MVar3 = MPP_ERR_VPUHW;
    }
    mpp_packet_add_segment_info(s,type,(RK_S32)sVar5,(regs->reg_st).bs_lgth_l32);
    uVar8 = 0;
  }
  else {
    param_00 = (undefined8 *)
               ((long)(*(int *)((long)hal + 0x204) * (task->flags).reg_idx) +
               *(long *)((long)hal + 0x208));
    local_48 = task;
    local_40 = mpp_packet_get_data(task->packet);
    uVar8 = uVar8 & 1;
    do {
      do {
        *param_00 = 0;
        uVar2 = 1;
        if (uVar8 == 0) {
          uVar2 = *(undefined4 *)((long)hal + 0x200);
        }
        *(undefined4 *)(param_00 + 1) = uVar2;
        *(undefined4 *)((long)param_00 + 0xc) = 0;
        mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,param_00);
      } while (*(int *)((long)param_00 + 0xc) < 1);
      lVar7 = 0;
      do {
        uVar1 = *(uint *)((long)param_00 + lVar7 * 4 + 0x10);
        len = uVar1 & 0x7fffffff;
        mpp_packet_add_segment_info(s,type,(int)sVar5,len);
        if (uVar8 != 0) {
          ctx_00 = *(MppCbCtx **)((long)hal + 0x1f8);
          ctx_00->cmd = ((int)uVar1 >> 0x1f) + 0x202;
          local_34 = len;
          mpp_callback_f("hal_h264e_vepu580_wait",ctx_00,&local_48);
        }
        sVar5 = (size_t)((int)sVar5 + len);
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)((long)param_00 + 0xc));
    } while (-1 < (int)uVar1);
    MVar3 = hal_h264e_vepu580_status_check(regs);
    if (MVar3 == MPP_OK) {
      task->hw_length = task->hw_length + (regs->reg_st).bs_lgth_l32;
    }
  }
  if (uVar8 == 0 && MVar3 == MPP_OK) {
    lVar7 = (long)(task->flags).reg_idx * 0x60;
    ctx = (HalH264eVepuStreamAmend *)(*(long *)((long)hal + 0x1a8) + lVar7);
    if (*(int *)(*(long *)((long)hal + 0x1a8) + lVar7) == 0) {
      if (ctx->prefix != (H264ePrefixNal *)0x0) {
        ctx->old_length = task->hw_length;
        h264e_vepu_stream_amend_sync_ref_idc(ctx);
      }
    }
    else {
      ctx->old_length = task->hw_length;
      lVar7 = *hal;
      ctx->slice->is_multi_slice = (uint)(*(int *)(lVar7 + 0xe94) != 0);
      h264e_vepu_stream_amend_proc(ctx,(MppEncH264HwCfg *)(lVar7 + 0x360));
      task->hw_length = ctx->new_length;
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p ret %d\n","hal_h264e_vepu580_wait",hal,
               (ulong)(uint)MVar3);
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_h264e_vepu580_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    RK_U32 split_out = ctx->cfg->split.split_out;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppEncH264HwCfg *hw_cfg = &ctx->cfg->codec.h264.hw_cfg;
    RK_S32 i;

    hal_h264e_dbg_func("enter %p\n", hal);

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (task->rc_task->frm.save_pass1)
        split_out = 0;

    /* update split_out in hw_cfg */
    hw_cfg->hw_split_out = split_out;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len;
        RK_U32 slice_last;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs +
                                                    task->flags.reg_idx * ctx->poll_cfg_size);
        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = split_out & MPP_ENC_SPLIT_OUT_LOWDELAY ? 1 : ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);

            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;

                mpp_packet_add_segment_info(pkt, type, offset, slice_len);
                offset += slice_len;

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) {
                    param.length = slice_len;

                    if (slice_last)
                        ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                    else
                        ctx->output_cb->cmd = ENC_OUTPUT_SLICE;

                    mpp_callback(ctx->output_cb, &param);
                }
            }
        } while (!slice_last);

        ret = hal_h264e_vepu580_status_check(regs);
        if (!ret)
            task->hw_length += regs->reg_st.bs_lgth_l32;
    } else {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret) {
            mpp_err_f("poll cmd failed %d\n", ret);
            ret = MPP_ERR_VPUHW;
        } else {
            ret = hal_h264e_vepu580_status_check(regs);
            if (!ret)
                task->hw_length += regs->reg_st.bs_lgth_l32;
        }

        mpp_packet_add_segment_info(pkt, type, offset, regs->reg_st.bs_lgth_l32);
    }

    if (!(split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) && !ret) {
        HalH264eVepuStreamAmend *amend = &ctx->amend_sets[task->flags.reg_idx];

        if (amend->enable) {
            amend->old_length = task->hw_length;
            amend->slice->is_multi_slice = (ctx->cfg->split.split_mode > 0);
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            task->hw_length = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = task->hw_length;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }

    hal_h264e_dbg_func("leave %p ret %d\n", hal, ret);

    return ret;
}